

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O0

_Type_CHARACTER * __thiscall
LiteScript::_Type_CHARACTER::ToString_abi_cxx11_(_Type_CHARACTER *this,Variable *obj)

{
  char32_t c;
  Object *this_00;
  Character *this_01;
  Variable *in_RDX;
  String local_40;
  Variable *obj_local;
  _Type_CHARACTER *this_local;
  
  obj_local = obj;
  this_local = this;
  this_00 = Variable::operator->(in_RDX);
  this_01 = Object::GetData<LiteScript::Character>(this_00);
  c = Character::operator_cast_to_char32_t(this_01);
  String::String(&local_40,c);
  String::operator_cast_to_string((String *)this);
  String::~String(&local_40);
  return this;
}

Assistant:

std::string LiteScript::_Type_CHARACTER::ToString(const LiteScript::Variable& obj) const {
    return String(obj->GetData<Character>());
}